

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HinOut.cpp
# Opt level: O0

double __thiscall HinOut::getdiff(HinOut *this,double v1,double v2)

{
  double *pdVar1;
  int in_EDI;
  double *__a;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double val;
  double mx;
  double local_38;
  double local_30;
  double local_28;
  double local_8;
  
  local_28 = 1.0;
  std::abs(in_EDI);
  if (1.0 < extraout_XMM0_Qa) {
    std::abs(in_EDI);
    std::abs(in_EDI);
    __a = &local_30;
    pdVar1 = std::max<double>(__a,&local_38);
    in_EDI = (int)__a;
    local_28 = *pdVar1;
  }
  std::abs(in_EDI);
  local_8 = extraout_XMM0_Qa_00 / local_28;
  if (local_8 <= 1e-08) {
    local_8 = 0.0;
  }
  return local_8;
}

Assistant:

double HinOut::getdiff(double v1,double v2) {
	double mx = 1;
	if (abs(v1) > 1)
		mx = max(abs(v1),abs(v2));

	double val = abs(v1-v2)/mx;
	if (val > 0.00000001)
		return	val;

	return 0;
}